

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

int __thiscall
ghc::filesystem::path::compare(path *this,basic_string_view<char,_std::char_traits<char>_> s)

{
  int iVar1;
  path local_40;
  string_view local_20;
  
  local_20._M_str = s._M_str;
  local_20._M_len = s._M_len;
  path<std::basic_string_view<char,std::char_traits<char>>,ghc::filesystem::path>
            (&local_40,&local_20,auto_format);
  iVar1 = std::__cxx11::string::compare((string *)this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._path._M_dataplus._M_p != &local_40._path.field_2) {
    operator_delete(local_40._path._M_dataplus._M_p,local_40._path.field_2._M_allocated_capacity + 1
                   );
  }
  return iVar1;
}

Assistant:

GHC_INLINE int path::compare(std::basic_string_view<value_type> s) const
{
    return native().compare(path(s).native());
}